

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpbyteaddress.cpp
# Opt level: O2

RTPAddress * __thiscall
jrtplib::RTPByteAddress::CreateCopy(RTPByteAddress *this,RTPMemoryManager *mgr)

{
  undefined2 uVar1;
  _func_int **pp_Var2;
  RTPAddress *pRVar3;
  _func_int **__n;
  
  pRVar3 = (RTPAddress *)operator_new(0xa0,mgr,0x17);
  pp_Var2 = (_func_int **)this->addresslength;
  uVar1 = this->port;
  pRVar3->addresstype = ByteAddress;
  pRVar3->_vptr_RTPAddress = (_func_int **)&PTR_CreateCopy_0014f680;
  __n = (_func_int **)0x80;
  if (pp_Var2 < (_func_int **)0x80) {
    __n = pp_Var2;
  }
  memcpy(&pRVar3->field_0xc,&(this->super_RTPAddress).field_0xc,(size_t)__n);
  pRVar3[9]._vptr_RTPAddress = __n;
  *(undefined2 *)&pRVar3[9].addresstype = uVar1;
  return pRVar3;
}

Assistant:

RTPAddress *RTPByteAddress::CreateCopy(RTPMemoryManager *mgr) const
{
	JRTPLIB_UNUSED(mgr); // possibly unused
	RTPByteAddress *a = RTPNew(mgr, RTPMEM_TYPE_CLASS_RTPADDRESS) RTPByteAddress(hostaddress, addresslength, port);
	return a;
}